

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Nf_ManPrepareGate(int nVars,word uTruth,int *pComp,int *pPerm,Vec_Wrd_t *vResult)

{
  word wVar1;
  int iVar2;
  ulong local_68;
  int local_5c;
  int local_58;
  int c;
  int p;
  int i;
  word tTemp2;
  word tTemp1;
  word tCur;
  int nMints;
  int nPerms;
  Vec_Wrd_t *vResult_local;
  int *pPerm_local;
  int *pComp_local;
  word uTruth_local;
  int nVars_local;
  
  iVar2 = Extra_Factorial(nVars);
  Vec_WrdClear(vResult);
  c = 0;
  do {
    if (1 < c) {
      return;
    }
    local_68 = uTruth;
    if (c != 0) {
      local_68 = uTruth ^ 0xffffffffffffffff;
    }
    tTemp1 = local_68;
    for (local_58 = 0; wVar1 = tTemp1, local_58 < iVar2; local_58 = local_58 + 1) {
      for (local_5c = 0; local_5c < 1 << ((byte)nVars & 0x1f); local_5c = local_5c + 1) {
        Vec_WrdPush(vResult,tTemp1);
        tTemp1 = Abc_Tt6Flip(tTemp1,pComp[local_5c]);
      }
      if (wVar1 != tTemp1) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                      ,0x54b,"void Nf_ManPrepareGate(int, word, int *, int *, Vec_Wrd_t *)");
      }
      tTemp1 = Abc_Tt6SwapAdjacent(tTemp1,pPerm[local_58]);
    }
    if (local_68 != tTemp1) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x54e,"void Nf_ManPrepareGate(int, word, int *, int *, Vec_Wrd_t *)");
    }
    c = c + 1;
  } while( true );
}

Assistant:

void Nf_ManPrepareGate( int nVars, word uTruth, int * pComp, int * pPerm, Vec_Wrd_t * vResult )
{
    int nPerms = Extra_Factorial( nVars );
    int nMints = (1 << nVars);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    Vec_WrdClear( vResult );
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                Vec_WrdPush( vResult, tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
}